

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64
drwav_read_pcm_frames_s32be(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  drwav_uint64 dVar3;
  drwav *in_RDX;
  long in_RDI;
  drwav_uint64 framesRead;
  drwav_uint64 iSample;
  drwav_int32 *in_stack_ffffffffffffffb8;
  drwav_uint64 in_stack_ffffffffffffffc0;
  ulong local_20;
  
  dVar3 = drwav_read_pcm_frames_s32(in_RDX,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (in_RDX != (drwav *)0x0) {
    uVar1 = *(ushort *)(in_RDI + 0x70);
    for (local_20 = 0; local_20 < dVar3 * uVar1; local_20 = local_20 + 1) {
      uVar2 = *(uint *)((in_RDX->fmt).subFormat + local_20 * 4 + -0x5c);
      *(uint *)((in_RDX->fmt).subFormat + local_20 * 4 + -0x5c) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
  }
  return dVar3;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s32be(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    drwav_uint64 framesRead = drwav_read_pcm_frames_s32(pWav, framesToRead, pBufferOut);
    if (pBufferOut != NULL && drwav__is_little_endian() == DRWAV_TRUE) {
        drwav__bswap_samples_s32(pBufferOut, framesRead*pWav->channels);
    }

    return framesRead;
}